

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

void duckdb::ComparisonExecutor::Execute<duckdb::GreaterThan>
               (Vector *left,Vector *right,Vector *result,idx_t count)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  InternalException *this;
  ValidityMask *null_mask;
  idx_t row_idx;
  ulong row_idx_00;
  idx_t i;
  idx_t iVar5;
  idx_t i_1;
  ulong uVar6;
  SelectionVector local_118;
  SelectionVector true_sel;
  ValidityMask original_mask;
  UnifiedVectorFormat leftv;
  UnifiedVectorFormat rightv;
  
  PVar1 = (left->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    BinaryExecutor::
    Execute<signed_char,signed_char,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case UINT8:
    BinaryExecutor::
    Execute<unsigned_char,unsigned_char,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case UINT16:
    BinaryExecutor::
    Execute<unsigned_short,unsigned_short,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case INT16:
    BinaryExecutor::
    Execute<short,short,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case UINT32:
    BinaryExecutor::
    Execute<unsigned_int,unsigned_int,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case INT32:
    BinaryExecutor::
    Execute<int,int,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case UINT64:
    BinaryExecutor::
    Execute<unsigned_long,unsigned_long,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case INT64:
    BinaryExecutor::
    Execute<long,long,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case FLOAT:
    BinaryExecutor::
    Execute<float,float,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case DOUBLE:
    BinaryExecutor::
    Execute<double,double,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case INTERVAL:
    BinaryExecutor::
    Execute<duckdb::interval_t,duckdb::interval_t,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
              (left,right,result,count);
    return;
  case LIST:
  case STRUCT:
  case ARRAY:
    break;
  default:
    if (PVar1 == VARCHAR) {
      BinaryExecutor::
      Execute<duckdb::string_t,duckdb::string_t,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
                (left,right,result,count);
      return;
    }
    if (PVar1 == UINT128) {
      BinaryExecutor::
      Execute<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
                (left,right,result,count);
      return;
    }
    if (PVar1 == INT128) {
      BinaryExecutor::
      Execute<duckdb::hugeint_t,duckdb::hugeint_t,bool,duckdb::GreaterThan,duckdb::BinarySingleArgumentOperatorWrapper>
                (left,right,result,count);
      return;
    }
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&leftv,"Invalid type for comparison",(allocator *)&rightv);
    InternalException::InternalException(this,(string *)&leftv);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((left->vector_type == CONSTANT_VECTOR) &&
      (puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 != (unsigned_long *)0x0)) && ((*puVar2 & 1) == 0)) {
LAB_0131460c:
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  if (right->vector_type == CONSTANT_VECTOR) {
    puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) goto LAB_0131460c;
    if (left->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      SelectionVector::SelectionVector((SelectionVector *)&leftv,1);
      iVar4 = VectorOperations::GreaterThan
                        (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0,1,
                         (SelectionVector *)&leftv,(optional_ptr<duckdb::SelectionVector,_true>)0x0,
                         (optional_ptr<duckdb::ValidityMask,_true>)&result->validity);
      TemplatedValidityMask<unsigned_long>::SetAllValid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,1);
      *result->data = iVar4 != 0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&leftv.validity);
      return;
    }
  }
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar3 = result->data;
  FlatVector::VerifyFlatVector(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&leftv);
  UnifiedVectorFormat::UnifiedVectorFormat(&rightv);
  Vector::ToUnifiedFormat(left,count,&leftv);
  Vector::ToUnifiedFormat(right,count,&rightv);
  null_mask = &result->validity;
  if (rightv.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0 ||
      leftv.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    ComparesNotNull(&leftv,&rightv,null_mask,count);
  }
  original_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  original_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  original_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  original_mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  TemplatedValidityMask<unsigned_long>::SetAllValid
            (&original_mask.super_TemplatedValidityMask<unsigned_long>,count);
  TemplatedValidityMask<unsigned_long>::Copy
            (&original_mask.super_TemplatedValidityMask<unsigned_long>,
             &null_mask->super_TemplatedValidityMask<unsigned_long>,count);
  SelectionVector::SelectionVector(&true_sel,count);
  SelectionVector::SelectionVector(&local_118,count);
  iVar4 = VectorOperations::GreaterThan
                    (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0,count,
                     &true_sel,&local_118,(optional_ptr<duckdb::ValidityMask,_true>)null_mask);
  for (iVar5 = 0; iVar4 != iVar5; iVar5 = iVar5 + 1) {
    row_idx = iVar5;
    if (true_sel.sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)true_sel.sel_vector[iVar5];
    }
    pdVar3[row_idx] = '\x01';
    if ((original_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((original_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[row_idx >> 6] >>
         (row_idx & 0x3f) & 1) != 0)) {
      TemplatedValidityMask<unsigned_long>::SetValid
                (&null_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
  }
  for (uVar6 = 0; count - iVar4 != uVar6; uVar6 = uVar6 + 1) {
    row_idx_00 = uVar6;
    if (local_118.sel_vector != (sel_t *)0x0) {
      row_idx_00 = (ulong)local_118.sel_vector[uVar6];
    }
    pdVar3[row_idx_00] = '\0';
    if ((original_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((original_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[row_idx_00 >> 6] >>
         (row_idx_00 & 0x3f) & 1) != 0)) {
      TemplatedValidityMask<unsigned_long>::SetValid
                (&null_mask->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&true_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&original_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  UnifiedVectorFormat::~UnifiedVectorFormat(&rightv);
  UnifiedVectorFormat::~UnifiedVectorFormat(&leftv);
  return;
}

Assistant:

static inline void Execute(Vector &left, Vector &right, Vector &result, idx_t count) {
		D_ASSERT(left.GetType().InternalType() == right.GetType().InternalType() &&
		         result.GetType() == LogicalType::BOOLEAN);
		// the inplace loops take the result as the last parameter
		switch (left.GetType().InternalType()) {
		case PhysicalType::BOOL:
		case PhysicalType::INT8:
			TemplatedExecute<int8_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT16:
			TemplatedExecute<int16_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT32:
			TemplatedExecute<int32_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT64:
			TemplatedExecute<int64_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT8:
			TemplatedExecute<uint8_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT16:
			TemplatedExecute<uint16_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT32:
			TemplatedExecute<uint32_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT64:
			TemplatedExecute<uint64_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT128:
			TemplatedExecute<hugeint_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT128:
			TemplatedExecute<uhugeint_t, OP>(left, right, result, count);
			break;
		case PhysicalType::FLOAT:
			TemplatedExecute<float, OP>(left, right, result, count);
			break;
		case PhysicalType::DOUBLE:
			TemplatedExecute<double, OP>(left, right, result, count);
			break;
		case PhysicalType::INTERVAL:
			TemplatedExecute<interval_t, OP>(left, right, result, count);
			break;
		case PhysicalType::VARCHAR:
			TemplatedExecute<string_t, OP>(left, right, result, count);
			break;
		case PhysicalType::LIST:
		case PhysicalType::STRUCT:
		case PhysicalType::ARRAY:
			NestedComparisonExecutor<OP>(left, right, result, count);
			break;
		default:
			throw InternalException("Invalid type for comparison");
		}
	}